

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

json __thiscall
jsonnet::internal::(anonymous_namespace)::Interpreter::yamlTreeToJson_abi_cxx11_
          (Interpreter *this,Tree *tree)

{
  json_value extraout_RDX;
  json jVar1;
  input_adapter iStack_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  _Any_data local_1a8;
  undefined8 local_198;
  undefined8 uStack_190;
  ostringstream jsonStream;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&jsonStream);
  c4::yml::as_json::as_json((as_json *)&local_1c8,tree);
  c4::yml::operator<<(&jsonStream,(as_json *)&local_1c8);
  std::__cxx11::stringbuf::str();
  nlohmann::detail::input_adapter::
  input_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&iStack_1d8,&local_1c8);
  local_198 = 0;
  uStack_190 = 0;
  local_1a8._M_unused._M_object = (void *)0x0;
  local_1a8._8_8_ = 0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::parse((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           *)this,&iStack_1d8,(parser_callback_t *)&local_1a8,true);
  std::_Function_base::~_Function_base((_Function_base *)&local_1a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&iStack_1d8.ia.
              super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&jsonStream);
  jVar1.m_value.object = extraout_RDX.object;
  jVar1._0_8_ = this;
  return jVar1;
}

Assistant:

const json yamlTreeToJson(const ryml::Tree& tree) {
        std::ostringstream jsonStream;
        jsonStream << ryml::as_json(tree);
        return json::parse(jsonStream.str());
    }